

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall
pbrt::
InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
::push_back(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
            *this,ParsedParameter **value)

{
  size_t sVar1;
  size_t sVar2;
  iterator ppPVar3;
  ParsedParameter **in_RSI;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDI;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *unaff_retaddr;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *n;
  
  n = in_RDI;
  sVar1 = size(in_RDI);
  sVar2 = capacity(in_RDI);
  if (sVar1 == sVar2) {
    capacity(in_RDI);
    reserve(unaff_retaddr,(size_t)n);
  }
  ppPVar3 = begin(in_RDI);
  pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>::
  construct<pbrt::ParsedParameter*,pbrt::ParsedParameter*const&>
            ((polymorphic_allocator<pbrt::ParsedParameter*> *)in_RDI,ppPVar3 + in_RDI->nStored,
             in_RSI);
  in_RDI->nStored = in_RDI->nStored + 1;
  return;
}

Assistant:

void push_back(const T &value) {
        if (size() == capacity())
            reserve(2 * capacity());

        alloc.construct(begin() + nStored, value);
        ++nStored;
    }